

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsForge.cpp
# Opt level: O0

void __thiscall gdsForge::gdsSRef(gdsForge *this,gdsSREF *in_SREF,bool minimal)

{
  string local_90;
  int local_70;
  int local_6c;
  int corXY [2];
  double arrDou [1];
  bitset<16UL> local_58;
  bitset<16UL> bits;
  string local_40;
  uint local_20;
  byte local_19;
  int data [1];
  bool minimal_local;
  gdsSREF *in_SREF_local;
  gdsForge *this_local;
  
  local_19 = minimal;
  _data = in_SREF;
  GDSwriteRec(this,0xa00);
  if ((local_19 & 1) == 0) {
    local_20 = _data->plex;
    GDSwriteInt(this,0x2f03,(int *)&local_20,1);
  }
  std::__cxx11::string::string((string *)&local_40,(string *)&_data->name);
  GDSwriteStr(this,0x1206,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::bitset<16UL>::bitset(&local_58);
  std::bitset<16UL>::set(&local_58,0xf,(bool)(_data->reflection & 1));
  if ((_data->scale != 1.0) || (NAN(_data->scale))) {
    std::bitset<16UL>::set(&local_58,2,true);
  }
  else {
    std::bitset<16UL>::set(&local_58,2,false);
  }
  if ((_data->angle != 0.0) || (NAN(_data->angle))) {
    std::bitset<16UL>::set(&local_58,1,true);
  }
  else {
    std::bitset<16UL>::set(&local_58,1,false);
  }
  GDSwriteBitArr(this,0x1a01,local_58);
  if ((_data->scale != 1.0) || (NAN(_data->scale))) {
    corXY = (int  [2])_data->scale;
    GDSwriteRea(this,0x1b05,(double *)corXY,1);
  }
  if ((_data->angle != 0.0) || (NAN(_data->angle))) {
    corXY = (int  [2])_data->angle;
    GDSwriteRea(this,0x1c05,(double *)corXY,1);
  }
  local_70 = _data->xCor;
  local_6c = _data->yCor;
  GDSwriteInt(this,0x1003,&local_70,2);
  if ((local_19 & 1) == 0) {
    local_20 = _data->propattr;
    GDSwriteInt(this,0x2b02,(int *)&local_20,1);
    std::__cxx11::string::string((string *)&local_90,(string *)&_data->propvalue);
    GDSwriteStr(this,0x2c06,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
  }
  GDSwriteRec(this,0x1100);
  return;
}

Assistant:

void gdsForge::gdsSRef(const gdsSREF &in_SREF, bool minimal)
{
  int data[1];
  this->GDSwriteRec(GDS_SREF);

  // ELFLAGS and PLEX are optional
  if (minimal == false) {
    data[0] = in_SREF.plex;
    this->GDSwriteInt(GDS_PLEX, data, 1);
  }

  // name of the structure that is referenced
  this->GDSwriteStr(GDS_SNAME, in_SREF.name);

  // two byte, bit array controlling reflection, magnification and rotation.
  bitset<16> bits;

  // reflect across x-axis
  bits.set(15, in_SREF.reflection);

  // magnification, default 1
  if (in_SREF.scale == 1)
    bits.set(2, 0);
  else
    bits.set(2, 1);

  // angle of rotation
  if (in_SREF.angle == 0)
    bits.set(1, 0);
  else
    bits.set(1, 1);

  this->GDSwriteBitArr(GDS_STRANS, bits);

  double arrDou[1];
  // Magnification, default 1
  if (in_SREF.scale != 1) {
    arrDou[0] = in_SREF.scale;
    this->GDSwriteRea(GDS_MAG, arrDou, 1);
  }

  // Angle measured counterclockwise
  if (in_SREF.angle != 0) {
    arrDou[0] = in_SREF.angle;
    this->GDSwriteRea(GDS_ANGLE, arrDou, 1);
  }

  int corXY[2];
  corXY[0] = in_SREF.xCor;
  corXY[1] = in_SREF.yCor;
  this->GDSwriteInt(GDS_XY, corXY, 2);

  // Optional goodies
  if (minimal == false) {
    data[0] = in_SREF.propattr;
    this->GDSwriteInt(GDS_PROPATTR, data, 1);

    this->GDSwriteStr(GDS_PROPVALUE, in_SREF.propvalue);
  }

  this->GDSwriteRec(GDS_ENDEL);
}